

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_utils.c
# Opt level: O0

char * vrna_filename_sanitize(char *name,char *replacement)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  void *p;
  char *pcVar4;
  uint n_suff;
  char *suff;
  uint diff;
  uint n;
  uint i;
  char *sanitized_name;
  char *illegal_chars;
  char *start;
  char *ptr;
  char *replacement_local;
  char *name_local;
  
  if (name != (char *)0x0) {
    sVar3 = strlen(name);
    p = vrna_alloc((int)sVar3 + 1);
    diff = 0;
    illegal_chars = name;
    while( true ) {
      pcVar4 = strpbrk(illegal_chars,"\\/?%*:|\"<> ");
      if (pcVar4 == (char *)0x0) break;
      strncpy((char *)((long)p + (ulong)diff),illegal_chars,(long)pcVar4 - (long)illegal_chars);
      uVar1 = diff + ((int)pcVar4 - (int)illegal_chars);
      diff = uVar1;
      if ((replacement != (char *)0x0) && (*replacement != '\0')) {
        diff = uVar1 + 1;
        *(char *)((long)p + (ulong)uVar1) = *replacement;
      }
      illegal_chars = pcVar4 + 1;
    }
    sVar3 = strlen(name);
    if (illegal_chars < name + sVar3) {
      sVar3 = strlen(name);
      uVar1 = ((int)name - (int)illegal_chars) + (int)sVar3;
      strncpy((char *)((long)p + (ulong)diff),illegal_chars,(ulong)uVar1);
      diff = uVar1 + diff;
    }
    _n = (char *)vrna_realloc(p,diff + 1);
    _n[diff] = '\0';
    iVar2 = strcmp(_n,".");
    if ((iVar2 == 0) || (iVar2 = strcmp(_n,".."), iVar2 == 0)) {
      _n = (char *)vrna_realloc(_n,1);
      *_n = '\0';
    }
    sVar3 = strlen(_n);
    if (0xff < (uint)sVar3) {
      pcVar4 = strrchr(_n,0x2e);
      if ((pcVar4 != (char *)0x0) && ((long)(_n + ((sVar3 & 0xffffffff) - (long)pcVar4)) < 0xff)) {
        uVar1 = ((int)_n + (uint)sVar3) - (int)pcVar4;
        memmove(_n + (0xff - uVar1),_n + ((sVar3 & 0xffffffff) - (ulong)uVar1),(ulong)uVar1);
      }
      _n = (char *)vrna_realloc(_n,0x100);
      _n[0xff] = '\0';
    }
    return _n;
  }
  return (char *)0x0;
}

Assistant:

PUBLIC char *
vrna_filename_sanitize(const char *name,
                       const char *replacement)
{
  if (name) {
    const char    *ptr, *start, *illegal_chars;
    char          *sanitized_name;
    unsigned int  i, n;

    illegal_chars   = "\\/?%*:|\"<> ";
    sanitized_name  = (char *)vrna_alloc(sizeof(char) * (strlen(name) + 1));
    start           = name;
    i               = 0;
    while ((ptr = strpbrk(start, illegal_chars))) {
      /* find illegal chars */
      strncpy(sanitized_name + i, start, ptr - start);
      i += ptr - start;
      if (replacement && (*replacement))
        sanitized_name[i++] = *replacement;

      start = ptr + 1; /* skip invalid character */
    }
    /* copy remaining part */
    if (start < (name + strlen(name))) {
      unsigned int diff = name - start + strlen(name);
      strncpy(sanitized_name + i, start, diff);
      i += diff;
    }

    /* resize the output string to actual requirements */
    sanitized_name    = (char *)vrna_realloc(sanitized_name, sizeof(char) * (i + 1));
    sanitized_name[i] = '\0';

    /* check for reserved unix file names */
    if ((!strcmp(sanitized_name, ".")) || (!strcmp(sanitized_name, ".."))) {
      sanitized_name    = (char *)vrna_realloc(sanitized_name, sizeof(char));
      sanitized_name[0] = '\0';
    }

    /* check for length restrictions */
    n = strlen(sanitized_name);
    if (n > 255) {
      char *suff = NULL;
      /* try to leave file suffix, i.e. everything after last dot '.', intact */
      if ((suff = strrchr(sanitized_name, '.')) && (sanitized_name + n - suff < 255)) {
        unsigned int n_suff = sanitized_name + n - suff;
        memmove(sanitized_name + (255 - n_suff), sanitized_name + n - n_suff,
                sizeof(char) * n_suff);
      }

      sanitized_name      = (char *)vrna_realloc(sanitized_name, sizeof(char) * 256);
      sanitized_name[255] = '\0';
    }

    /* finally, return the sanitized file name */
    return sanitized_name;
  } else {
    return NULL;
  }
}